

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O0

void * sx__aligned_alloc(sx_alloc *alloc,size_t size,uint32_t align,char *file,char *func,
                        uint32_t line)

{
  code *pcVar1;
  void *pvVar2;
  void *pvVar3;
  uint local_64;
  uint32_t *header;
  uint8_t *aligned;
  uint8_t *ptr;
  size_t total;
  int var__b;
  int var__a;
  uint32_t line_local;
  char *func_local;
  char *file_local;
  uint32_t align_local;
  size_t size_local;
  sx_alloc *alloc_local;
  
  local_64 = align;
  if ((int)align < 9) {
    local_64 = 8;
  }
  pvVar2 = sx__malloc(alloc,size + local_64 + 4,0,file,func,line);
  if (pvVar2 != (void *)0x0) {
    pvVar3 = sx_align_ptr(pvVar2,4,local_64);
    *(int *)((long)pvVar3 + -4) = (int)pvVar3 - (int)pvVar2;
    return pvVar3;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/allocator.h"
                    ,0xb0,"ptr");
  pcVar1 = (code *)swi(3);
  pvVar2 = (void *)(*pcVar1)();
  return pvVar2;
}

Assistant:

SX_INLINE void* sx__aligned_alloc(const sx_alloc* alloc, size_t size, uint32_t align, 
                                  const char* file, const char* func, uint32_t line)
{
    align = sx_max((int)align, SX_CONFIG_ALLOCATOR_NATURAL_ALIGNMENT);
    const size_t total = size + align + sizeof(uint32_t);
    uint8_t* ptr = (uint8_t*)sx__malloc(alloc, total, 0, file, func, line);
    sx_assert(ptr);
    uint8_t* aligned = (uint8_t*)sx_align_ptr(ptr, sizeof(uint32_t), align);
    uint32_t* header = (uint32_t*)aligned - 1;
    *header = (uint32_t)(uintptr_t)(aligned - ptr);
    return aligned;
}